

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O2

int push_const_val(c2m_ctx_t c2m_ctx,node_t_conflict r,op_t *res)

{
  longdouble ld;
  byte *pbVar1;
  type *type;
  MIR_context_t ctx;
  int iVar2;
  MIR_type_t MVar3;
  undefined8 uStack_c0;
  MIR_op_t local_88;
  void *local_58;
  undefined8 uStack_50;
  int64_t iStack_48;
  char *pcStack_40;
  undefined8 uStack_38;
  MIR_disp_t MStack_30;
  
  pbVar1 = (byte *)r->attr;
  iVar2 = 0;
  if ((*pbVar1 & 1) != 0) {
    type = *(type **)(pbVar1 + 0x18);
    ctx = c2m_ctx->ctx;
    iVar2 = floating_type_p(type);
    if (iVar2 == 0) {
      iVar2 = integer_type_p(type);
      if ((iVar2 == 0) && (type->mode != TM_PTR)) {
        __assert_fail("integer_type_p (e->type) || e->type->mode == TM_PTR",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                      ,0x28d6,"int push_const_val(c2m_ctx_t, node_t, op_t *)");
      }
      iVar2 = signed_integer_type_p(type);
      if (iVar2 == 0) {
        MIR_new_uint_op(ctx,*(uint64_t *)(pbVar1 + 0x30));
      }
      else {
        MIR_new_int_op(ctx,*(uint64_t *)(pbVar1 + 0x30));
      }
    }
    else {
      MVar3 = get_mir_type(c2m_ctx,type);
      ld = *(longdouble *)(pbVar1 + 0x30);
      if (MVar3 == MIR_T_D) {
        MIR_new_double_op(ctx,(double)ld);
        local_58 = local_88.data;
        uStack_50 = local_88._8_8_;
        iStack_48 = local_88.u.i;
        pcStack_40 = local_88.u.str.s;
        uStack_38 = local_88.u._16_8_;
        MStack_30 = local_88.u.mem.disp;
      }
      else if (MVar3 == MIR_T_F) {
        MIR_new_float_op(ctx,(float)ld);
        local_58 = local_88.data;
        uStack_50 = local_88._8_8_;
        iStack_48 = local_88.u.i;
        pcStack_40 = local_88.u.str.s;
        uStack_38 = local_88.u._16_8_;
        MStack_30 = local_88.u.mem.disp;
      }
      else {
        MIR_new_ldouble_op(&local_88,ctx,ld);
        local_58 = local_88.data;
        uStack_50 = local_88._8_8_;
        iStack_48 = local_88.u.i;
        pcStack_40 = local_88.u.str.s;
        uStack_38 = local_88.u._16_8_;
        MStack_30 = local_88.u.mem.disp;
      }
    }
    res->decl = (decl_t)0x0;
    *(undefined8 *)&res->field_0x8 = uStack_c0;
    (res->mir_op).data = local_58;
    *(undefined8 *)&(res->mir_op).field_0x8 = uStack_50;
    (res->mir_op).u.i = iStack_48;
    (res->mir_op).u.i = iStack_48;
    (res->mir_op).u.str.s = pcStack_40;
    *(undefined8 *)((long)&(res->mir_op).u + 0x10) = uStack_38;
    (res->mir_op).u.mem.disp = MStack_30;
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

static int push_const_val (c2m_ctx_t c2m_ctx, node_t r, op_t *res) {
  MIR_context_t ctx = c2m_ctx->ctx;
  struct expr *e = (struct expr *) r->attr;
  MIR_type_t mir_type;

  if (!e->const_p) return FALSE;
  if (floating_type_p (e->type)) {
    /* MIR support only IEEE float and double */
    mir_type = get_mir_type (c2m_ctx, e->type);
    *res = new_op (NULL, (mir_type == MIR_T_F   ? MIR_new_float_op (ctx, (float) e->c.d_val)
                          : mir_type == MIR_T_D ? MIR_new_double_op (ctx, e->c.d_val)
                                                : MIR_new_ldouble_op (ctx, e->c.d_val)));
  } else {
    assert (integer_type_p (e->type) || e->type->mode == TM_PTR);
    *res = new_op (NULL, (signed_integer_type_p (e->type) ? MIR_new_int_op (ctx, e->c.i_val)
                                                          : MIR_new_uint_op (ctx, e->c.u_val)));
  }
  return TRUE;
}